

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O3

void parse_bios_version(uint16_t offset)

{
  uint8_t *puVar1;
  uint uVar2;
  byte bVar3;
  undefined6 in_register_0000003a;
  ulong uVar4;
  
  puVar1 = bios->data;
  uVar4 = CONCAT62(in_register_0000003a,offset) & 0xffffffff;
  major_version = puVar1[uVar4 + 3];
  chip_version = puVar1[uVar4 + 2];
  if (card_codename == 0) {
    card_codename = (uint32_t)chip_version;
  }
  minor_version = puVar1[uVar4 + 1];
  micro_version = puVar1[uVar4];
  uVar2 = (uint)major_version;
  if ((0x14 < uVar2) || (bVar3 = 4, (0x100007U >> (uVar2 & 0x1f) & 1) == 0)) {
    if (major_version < 5) {
      bVar3 = (byte)card_codename & 0xf0;
    }
    else {
      bVar3 = 0x40;
      if ((0x5f < major_version) && (bVar3 = 0x50, 0x6f < major_version)) {
        if (major_version < 0x75) {
          bVar3 = 0xc0;
          if (card_codename - 0x11 < 0xf) {
            bVar3 = 0x50;
          }
        }
        else {
          bVar3 = 0xd0;
          if (uVar2 != 0x75) goto LAB_0016e1ae;
        }
      }
    }
  }
  chipset_family = bVar3;
LAB_0016e1ae:
  printf("Bios version %02x.%02x.%02x.%02x\n\n",(ulong)puVar1[uVar4 + 3],(ulong)puVar1[uVar4 + 2],
         (ulong)puVar1[uVar4 + 1],(ulong)puVar1[uVar4]);
  printf("Card codename %02x\n",(ulong)card_codename);
  printf("Card chipset family %02x\n\n",(ulong)chipset_family);
  return;
}

Assistant:

static void parse_bios_version(uint16_t offset)
{
	/*
	 * offset + 0  (8 bits): Micro version
	 * offset + 1  (8 bits): Minor version
	 * offset + 2  (8 bits): Chip version
	 * offset + 3  (8 bits): Major version
	 */

	major_version = bios->data[offset + 3];
	chip_version = bios->data[offset + 2];
	if(card_codename <= 0)
		card_codename = chip_version;
	minor_version = bios->data[offset + 1];
	micro_version = bios->data[offset + 0];

	if (major_version <= 0x2 || major_version == 0x14)
		chipset_family = 0x04;
	else if (major_version < 0x5)
		chipset_family = card_codename & 0xf0;
	else if (major_version < 0x60)
		chipset_family = 0x40;
	else if (major_version < 0x70)
		chipset_family = 0x50;
	else if (major_version < 0x75)
		if (card_codename > 0x10 && card_codename < 0x20)
			chipset_family = 0x50;
		else
			chipset_family = 0xc0;
	else if (major_version == 0x75)
		chipset_family = 0xd0;

	printf("Bios version %02x.%02x.%02x.%02x\n\n",
		 bios->data[offset + 3], bios->data[offset + 2],
		 bios->data[offset + 1], bios->data[offset]);
	printf("Card codename %02x\n",
		 card_codename);
	printf("Card chipset family %02x\n\n",
		 chipset_family);
}